

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O1

int ecx_setupnic(ecx_portt *port,char *ifname,int secondary)

{
  uint8 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ecx_portt *peVar5;
  long lVar6;
  timeval timeout;
  sockaddr_ll sll;
  ifreq ifr;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 local_78;
  sockaddr local_6c;
  char local_58 [16];
  uint local_48;
  
  if (secondary == 0) {
    pthread_mutex_init((pthread_mutex_t *)&port->getindex_mutex,(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)&port->tx_mutex,(pthread_mutexattr_t *)0x0);
    pthread_mutex_init((pthread_mutex_t *)&port->rx_mutex,(pthread_mutexattr_t *)0x0);
    port->sockhandle = -1;
    port->lastidx = 0;
    port->redstate = 0;
    (port->stack).sock = &port->sockhandle;
    peVar5 = port;
  }
  else {
    peVar5 = (ecx_portt *)port->redport;
    if (peVar5 == (ecx_portt *)0x0) {
      return 0;
    }
    peVar5->sockhandle = -1;
    port->redstate = 1;
    (peVar5->stack).sock = &peVar5->sockhandle;
  }
  (peVar5->stack).txbuf = &port->txbuf;
  (peVar5->stack).txbuflength = &port->txbuflength;
  (peVar5->stack).tempbuf = &peVar5->tempinbuf;
  (peVar5->stack).rxbuf = &peVar5->rxbuf;
  (peVar5->stack).rxbufstat = &peVar5->rxbufstat;
  (peVar5->stack).rxsa = &peVar5->rxsa;
  iVar4 = socket(0x11,3,0xa488);
  peVar5->sockhandle = iVar4;
  local_80 = 0;
  local_78 = 1;
  setsockopt(iVar4,1,0x14,&local_80,0x10);
  setsockopt(peVar5->sockhandle,1,0x15,&local_80,0x10);
  local_84 = 1;
  setsockopt(peVar5->sockhandle,1,5,&local_84,4);
  strcpy(local_58,ifname);
  lVar6 = 0;
  ioctl(peVar5->sockhandle,0x8933,local_58);
  uVar2 = local_48;
  strcpy(local_58,ifname);
  local_48 = local_48 & 0xffff0000;
  ioctl(peVar5->sockhandle,0x8913,local_58);
  local_48 = CONCAT22(local_48._2_2_,1);
  ioctl(peVar5->sockhandle,0x8913,local_58);
  uVar3 = local_48;
  local_6c.sa_family = 0x11;
  local_6c.sa_data[0] = -0x78;
  local_6c.sa_data[1] = -0x5c;
  local_48._0_1_ = (undefined1)uVar2;
  local_48._1_1_ = SUB41(uVar2,1);
  local_48._2_1_ = SUB41(uVar2,2);
  local_48._3_1_ = SUB41(uVar2,3);
  local_6c.sa_data[2] = (undefined1)local_48;
  local_6c.sa_data[3] = local_48._1_1_;
  local_6c.sa_data[4] = local_48._2_1_;
  local_6c.sa_data[5] = local_48._3_1_;
  local_48 = uVar3;
  iVar4 = bind(peVar5->sockhandle,&local_6c,0x14);
  port->rxbufstat[0] = 0;
  port->rxbufstat[1] = 0;
  port->rxbufstat[2] = 0;
  port->rxbufstat[3] = 0;
  port->rxbufstat[4] = 0;
  port->rxbufstat[5] = 0;
  port->rxbufstat[6] = 0;
  port->rxbufstat[7] = 0;
  port->rxbufstat[8] = 0;
  port->rxbufstat[9] = 0;
  port->rxbufstat[10] = 0;
  port->rxbufstat[0xb] = 0;
  port->rxbufstat[0xc] = 0;
  port->rxbufstat[0xd] = 0;
  port->rxbufstat[0xe] = 0;
  port->rxbufstat[0xf] = 0;
  do {
    puVar1 = port->txbuf[0] + lVar6;
    puVar1[0] = 0xff;
    puVar1[1] = 0xff;
    puVar1[2] = 0xff;
    puVar1[3] = 0xff;
    puVar1[4] = 0xff;
    puVar1[5] = 0xff;
    puVar1[6] = '\x01';
    puVar1[7] = '\x01';
    puVar1 = port->txbuf[0] + lVar6 + 8;
    puVar1[0] = '\x01';
    puVar1[1] = '\x01';
    puVar1[2] = '\x01';
    puVar1[3] = '\x01';
    puVar1 = port->txbuf[0] + lVar6 + 0xc;
    puVar1[0] = 0x88;
    puVar1[1] = 0xa4;
    lVar6 = lVar6 + 0x5ee;
  } while (lVar6 != 0x5ee0);
  port->txbuf2[0] = 0xff;
  port->txbuf2[1] = 0xff;
  port->txbuf2[2] = 0xff;
  port->txbuf2[3] = 0xff;
  port->txbuf2[4] = 0xff;
  port->txbuf2[5] = 0xff;
  port->txbuf2[6] = '\x01';
  port->txbuf2[7] = '\x01';
  port->txbuf2[8] = '\x01';
  port->txbuf2[9] = '\x01';
  port->txbuf2[10] = '\x01';
  port->txbuf2[0xb] = '\x01';
  port->txbuf2[0xc] = 0x88;
  port->txbuf2[0xd] = 0xa4;
  return (uint)(iVar4 == 0);
}

Assistant:

int ecx_setupnic(ecx_portt *port, const char *ifname, int secondary) 
{
   int i;
   int r, rval, ifindex;
   struct timeval timeout;
   struct ifreq ifr;
   struct sockaddr_ll sll;
   int *psock;

   rval = 0;
   if (secondary)
   {
      /* secondary port stuct available? */
      if (port->redport)
      {
         /* when using secondary socket it is automatically a redundant setup */
         psock = &(port->redport->sockhandle);
         *psock = -1;
         port->redstate                   = ECT_RED_DOUBLE;
         port->redport->stack.sock        = &(port->redport->sockhandle);
         port->redport->stack.txbuf       = &(port->txbuf);
         port->redport->stack.txbuflength = &(port->txbuflength);
         port->redport->stack.tempbuf     = &(port->redport->tempinbuf);
         port->redport->stack.rxbuf       = &(port->redport->rxbuf);
         port->redport->stack.rxbufstat   = &(port->redport->rxbufstat);
         port->redport->stack.rxsa        = &(port->redport->rxsa);
      }
      else
      {
         /* fail */
         return 0;
      }
   }
   else
   {

#ifdef RTNET
      rt_mutex_create(&port->getindex_mutex, "getindex_mutex");
      rt_mutex_create(&port->tx_mutex, "tx_mutex");
      rt_mutex_create(&port->rx_mutex, "rx_mutex");
#else
      pthread_mutex_init(&(port->getindex_mutex), NULL);
      pthread_mutex_init(&(port->tx_mutex)      , NULL);
      pthread_mutex_init(&(port->rx_mutex)      , NULL);
#endif //RTNET

      port->sockhandle        = -1;
      port->lastidx           = 0;
      port->redstate          = ECT_RED_NONE;
      port->stack.sock        = &(port->sockhandle);
      port->stack.txbuf       = &(port->txbuf);
      port->stack.txbuflength = &(port->txbuflength);
      port->stack.tempbuf     = &(port->tempinbuf);
      port->stack.rxbuf       = &(port->rxbuf);
      port->stack.rxbufstat   = &(port->rxbufstat);
      port->stack.rxsa        = &(port->rxsa);
      psock = &(port->sockhandle);
   }   
   /* we use RAW packet socket, with packet type ETH_P_ECAT */
   *psock = SOCKET(PF_PACKET, SOCK_RAW, htons(ETH_P_ECAT));
   
   timeout.tv_sec =  0;
   timeout.tv_usec = 1; 
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_RCVTIMEO, &timeout, sizeof(timeout));
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_SNDTIMEO, &timeout, sizeof(timeout));
   i = 1;
   r = SETSOCKOPT(*psock, SOL_SOCKET, SO_DONTROUTE, &i, sizeof(i));
   /* connect socket to NIC by name */
   strcpy(ifr.ifr_name, ifname);
   r = IOCTL(*psock, SIOCGIFINDEX, &ifr);
   ifindex = ifr.ifr_ifindex;
   strcpy(ifr.ifr_name, ifname);
   ifr.ifr_flags = 0;
   /* reset flags of NIC interface */
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* set flags of NIC interface, here promiscuous and broadcast */
   ifr.ifr_flags = ifr.ifr_flags || IFF_PROMISC || IFF_BROADCAST;
   r = IOCTL(*psock, SIOCGIFFLAGS, &ifr);
   /* bind socket to protocol, in this case RAW EtherCAT */
   sll.sll_family = AF_PACKET;
   sll.sll_ifindex = ifindex;
   sll.sll_protocol = htons(ETH_P_ECAT);
   r = BIND(*psock, (struct sockaddr *)&sll, sizeof(sll));
   /* setup ethernet headers in tx buffers so we don't have to repeat it */
   for (i = 0; i < EC_MAXBUF; i++) 
   {
      ec_setupheader(&(port->txbuf[i]));
      port->rxbufstat[i] = EC_BUF_EMPTY;
   }
   ec_setupheader(&(port->txbuf2));
   if (r == 0) rval = 1;
   
   return rval;
}